

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

CURLcode cpfds_increase(curl_pollfds *cpfds,uint inc)

{
  uint uVar1;
  pollfd *__dest;
  uint new_count;
  pollfd *new_fds;
  uint inc_local;
  curl_pollfds *cpfds_local;
  
  uVar1 = cpfds->count + inc;
  __dest = (pollfd *)(*Curl_ccalloc)((size_t)uVar1,8);
  if (__dest == (pollfd *)0x0) {
    cpfds_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(__dest,cpfds->pfds,(ulong)cpfds->count << 3);
    if ((cpfds->field_0x10 & 1) != 0) {
      (*Curl_cfree)(cpfds->pfds);
    }
    cpfds->pfds = __dest;
    cpfds->count = uVar1;
    cpfds->field_0x10 = cpfds->field_0x10 & 0xfe | 1;
    cpfds_local._4_4_ = CURLE_OK;
  }
  return cpfds_local._4_4_;
}

Assistant:

static CURLcode cpfds_increase(struct curl_pollfds *cpfds, unsigned int inc)
{
  struct pollfd *new_fds;
  unsigned int new_count = cpfds->count + inc;

  new_fds = calloc(new_count, sizeof(struct pollfd));
  if(!new_fds)
    return CURLE_OUT_OF_MEMORY;

  memcpy(new_fds, cpfds->pfds, cpfds->count * sizeof(struct pollfd));
  if(cpfds->allocated_pfds)
    free(cpfds->pfds);
  cpfds->pfds = new_fds;
  cpfds->count = new_count;
  cpfds->allocated_pfds = TRUE;
  return CURLE_OK;
}